

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O0

bool_t strIsPrintable(char *str)

{
  char *pcVar1;
  char *in_RDI;
  char *local_10;
  
  local_10 = in_RDI;
  while( true ) {
    if (*local_10 == '\0') {
      return 1;
    }
    if ((((*local_10 < '0') || ('9' < *local_10)) && ((*local_10 < 'A' || ('Z' < *local_10)))) &&
       (((*local_10 < 'a' || ('z' < *local_10)) &&
        (pcVar1 = strchr(" \'()+,-./:=?",(int)*local_10), pcVar1 == (char *)0x0)))) break;
    local_10 = local_10 + 1;
  }
  return 0;
}

Assistant:

bool_t strIsPrintable(const char* str)
{
	ASSERT(strIsValid(str));
	for (; *str; ++str)
		if ((*str < '0' || *str > '9') &&
			(*str < 'A' || *str > 'Z') &&
			(*str < 'a' || *str > 'z') &&
			strchr(" '()+,-./:=?", *str) == 0)
			return FALSE;
	return TRUE;
}